

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-event.c
# Opt level: O2

int run_test_fs_event_watch_file(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  undefined8 uVar3;
  char *pcVar4;
  
  puVar2 = uv_default_loop();
  remove("watch_dir/file2");
  remove("watch_dir/file1");
  remove("watch_dir/");
  create_dir("watch_dir");
  create_file("watch_dir/file1");
  create_file("watch_dir/file2");
  iVar1 = uv_fs_event_init(puVar2,&fs_event);
  if (iVar1 == 0) {
    iVar1 = uv_fs_event_start(&fs_event,fs_event_cb_file,"watch_dir/file2",0);
    if (iVar1 == 0) {
      iVar1 = uv_timer_init(puVar2,&timer);
      if (iVar1 == 0) {
        iVar1 = uv_timer_start(&timer,timer_cb_file,100,100);
        if (iVar1 == 0) {
          uv_run(puVar2,UV_RUN_DEFAULT);
          if (fs_event_cb_called == 1) {
            if (timer_cb_called == 2) {
              if (close_cb_called == 2) {
                remove("watch_dir/file2");
                remove("watch_dir/file1");
                remove("watch_dir/");
                puVar2 = uv_default_loop();
                close_loop(puVar2);
                puVar2 = uv_default_loop();
                iVar1 = uv_loop_close(puVar2);
                if (iVar1 == 0) {
                  return 0;
                }
                pcVar4 = "0 == uv_loop_close(uv_default_loop())";
                uVar3 = 0x268;
              }
              else {
                pcVar4 = "close_cb_called == 2";
                uVar3 = 0x261;
              }
            }
            else {
              pcVar4 = "timer_cb_called == 2";
              uVar3 = 0x260;
            }
          }
          else {
            pcVar4 = "fs_event_cb_called == 1";
            uVar3 = 0x25f;
          }
        }
        else {
          pcVar4 = "r == 0";
          uVar3 = 0x25b;
        }
      }
      else {
        pcVar4 = "r == 0";
        uVar3 = 0x259;
      }
    }
    else {
      pcVar4 = "r == 0";
      uVar3 = 599;
    }
  }
  else {
    pcVar4 = "r == 0";
    uVar3 = 0x255;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-event.c"
          ,uVar3,pcVar4);
  abort();
}

Assistant:

TEST_IMPL(fs_event_watch_file) {
#if defined(NO_FS_EVENTS)
  RETURN_SKIP(NO_FS_EVENTS);
#endif

  uv_loop_t* loop = uv_default_loop();
  int r;

  /* Setup */
  remove("watch_dir/file2");
  remove("watch_dir/file1");
  remove("watch_dir/");
  create_dir("watch_dir");
  create_file("watch_dir/file1");
  create_file("watch_dir/file2");

  r = uv_fs_event_init(loop, &fs_event);
  ASSERT(r == 0);
  r = uv_fs_event_start(&fs_event, fs_event_cb_file, "watch_dir/file2", 0);
  ASSERT(r == 0);
  r = uv_timer_init(loop, &timer);
  ASSERT(r == 0);
  r = uv_timer_start(&timer, timer_cb_file, 100, 100);
  ASSERT(r == 0);

  uv_run(loop, UV_RUN_DEFAULT);

  ASSERT(fs_event_cb_called == 1);
  ASSERT(timer_cb_called == 2);
  ASSERT(close_cb_called == 2);

  /* Cleanup */
  remove("watch_dir/file2");
  remove("watch_dir/file1");
  remove("watch_dir/");

  MAKE_VALGRIND_HAPPY();
  return 0;
}